

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorNode::AnalyzeChild(DescriptorNode *this,string *descriptor,uint32_t depth)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string *this_00;
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  CfdException *pCVar5;
  char *pcVar6;
  ulong uVar7;
  allocator local_699;
  string local_698;
  CfdSourceLocation local_678;
  CfdSourceLocation local_660;
  undefined1 local_648 [8];
  DescriptorNode node_2;
  CfdSourceLocation local_4c0;
  CfdSourceLocation local_4a8;
  string local_490 [32];
  string local_470 [32];
  undefined1 local_450 [8];
  DescriptorNode node_1;
  string local_2d0 [32];
  undefined1 local_2b0 [8];
  DescriptorNode node;
  string local_140;
  CfdSourceLocation local_120;
  undefined1 local_102;
  allocator local_101;
  string local_100;
  CfdSourceLocation local_e0;
  string local_c8 [32];
  string local_a8 [32];
  char *local_88;
  char *str;
  size_t idx;
  CfdSourceLocation local_68;
  undefined1 local_50 [8];
  string descriptor_main;
  bool exist_child_node;
  uint32_t depth_work;
  size_t offset;
  bool is_terminate;
  uint32_t depth_local;
  string *descriptor_local;
  DescriptorNode *this_local;
  
  bVar2 = false;
  descriptor_main.field_2._M_local_buf[0xb] = '\0';
  this->depth_ = depth;
  descriptor_main.field_2._12_4_ = depth;
  ::std::__cxx11::string::string((string *)local_50);
  local_68.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
               ,0x2f);
  local_68.filename = local_68.filename + 1;
  local_68.line = 900;
  local_68.funcname = "AnalyzeChild";
  logger::info<std::__cxx11::string_const&>(&local_68,"AnalyzeChild = {}",descriptor);
  str = (char *)0x0;
  do {
    pcVar6 = str;
    pcVar3 = (char *)::std::__cxx11::string::size();
    if (pcVar3 <= pcVar6) {
      uVar7 = ::std::__cxx11::string::empty();
      if (((((uVar7 & 1) == 0) &&
           (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)this,"addr"), !bVar2)) &&
          (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)this,"raw"), !bVar2)) &&
         (bVar2 = ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                  empty(&this->child_node_), bVar2)) {
        local_678.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                     ,0x2f);
        local_678.filename = local_678.filename + 1;
        local_678.line = 0x3eb;
        local_678.funcname = "AnalyzeChild";
        logger::warn<>(&local_678,"Failed to child node empty.");
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_698,"Failed to child node empty.",&local_699);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_698);
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      uVar7 = ::std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        CheckChecksum(this,(string *)local_50);
      }
      ::std::__cxx11::string::~string((string *)local_50);
      return;
    }
    local_88 = (char *)::std::__cxx11::string::operator[]((ulong)descriptor);
    if (*local_88 == '#') {
      if (!bVar2) {
        local_120.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                     ,0x2f);
        local_120.filename = local_120.filename + 1;
        local_120.line = 0x393;
        local_120.funcname = "AnalyzeChild";
        logger::warn<>(&local_120,"Illegal checksum data.");
        node.parent_kind_.field_2._M_local_buf[0xe] = '\x01';
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_140,"Illegal checksum data.",
                   (allocator *)(node.parent_kind_.field_2._M_local_buf + 0xf));
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_140);
        node.parent_kind_.field_2._M_local_buf[0xe] = '\0';
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::__cxx11::string::substr((ulong)local_a8,(ulong)descriptor);
      ::std::__cxx11::string::operator=((string *)&this->checksum_,local_a8);
      ::std::__cxx11::string::~string(local_a8);
      ::std::__cxx11::string::substr((ulong)local_c8,(ulong)descriptor);
      ::std::__cxx11::string::operator=((string *)local_50,local_c8);
      ::std::__cxx11::string::~string(local_c8);
      lVar4 = ::std::__cxx11::string::find((char *)&this->checksum_,0x3826b0);
      if (lVar4 != -1) {
        local_e0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                     ,0x2f);
        local_e0.filename = local_e0.filename + 1;
        local_e0.line = 0x38e;
        local_e0.funcname = "AnalyzeChild";
        logger::warn<>(&local_e0,"Illegal data. Multiple \'#\' symbols.");
        local_102 = 1;
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_100,"Multiple \'#\' symbols.",&local_101);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_100);
        local_102 = 0;
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    else if (*local_88 == ',') {
      if ((descriptor_main.field_2._M_local_buf[0xb] & 1U) == 0) {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)this,"multi");
        if ((bVar1) ||
           (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)this,"sortedmulti"), bVar1)) {
          DescriptorNode((DescriptorNode *)local_2b0,&this->addr_prefixes_);
          ::std::__cxx11::string::substr((ulong)local_2d0,(ulong)descriptor);
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (node.name_.field_2._M_local_buf + 8);
          ::std::__cxx11::string::operator=((string *)args,local_2d0);
          ::std::__cxx11::string::~string(local_2d0);
          pcVar6 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                           ,0x2f);
          node_1.parent_kind_.field_2._8_8_ = pcVar6 + 1;
          logger::info<std::__cxx11::string&>
                    ((CfdSourceLocation *)((long)&node_1.parent_kind_.field_2 + 8),
                     "multisig, node.value_ = {}",args);
          bVar1 = ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                  empty(&this->child_node_);
          if (bVar1) {
            node.depth_ = 3;
            pcVar6 = (char *)::std::__cxx11::string::c_str();
            node.tweak_sum_.field_2._8_4_ = atoi(pcVar6);
          }
          else {
            node.depth_ = 2;
          }
          node.checksum_.field_2._8_4_ = depth + 1;
          ::std::__cxx11::string::operator=
                    ((string *)
                     &node.addr_prefixes_.
                      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (string *)&this->parent_kind_);
          ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
          push_back(&this->child_node_,(value_type *)local_2b0);
          ~DescriptorNode((DescriptorNode *)local_2b0);
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)this,"tr");
          if ((bVar1) &&
             (bVar1 = ::std::
                      vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                      ::empty(&this->child_node_), bVar1)) {
            DescriptorNode((DescriptorNode *)local_450,&this->addr_prefixes_);
            ::std::__cxx11::string::substr((ulong)local_470,(ulong)descriptor);
            ::std::__cxx11::string::operator=
                      ((string *)(node_1.name_.field_2._M_local_buf + 8),local_470);
            ::std::__cxx11::string::~string(local_470);
            node_1.depth_ = 2;
            node_1.checksum_.field_2._8_4_ = depth + 1;
            ::std::__cxx11::string::operator=
                      ((string *)
                       &node_1.addr_prefixes_.
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (string *)&this->parent_kind_);
            ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
            push_back(&this->child_node_,(value_type *)local_450);
            ~DescriptorNode((DescriptorNode *)local_450);
          }
        }
      }
    }
    else if (*local_88 != ' ') {
      if (*local_88 == '(') {
        if (descriptor_main.field_2._12_4_ == depth) {
          ::std::__cxx11::string::substr((ulong)local_490,(ulong)descriptor);
          ::std::__cxx11::string::operator=((string *)this,local_490);
          ::std::__cxx11::string::~string(local_490);
        }
        else {
          descriptor_main.field_2._M_local_buf[0xb] = '\x01';
        }
        local_4a8.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                     ,0x2f);
        local_4a8.filename = local_4a8.filename + 1;
        local_4a8.line = 0x3c2;
        local_4a8.funcname = "AnalyzeChild";
        logger::info<unsigned_int&,std::__cxx11::string&>
                  (&local_4a8,"Target`(` depth_work={}, name={}",
                   (uint *)(descriptor_main.field_2._M_local_buf + 0xc),&this->name_);
        descriptor_main.field_2._12_4_ = descriptor_main.field_2._12_4_ + 1;
      }
      else if (*local_88 == ')') {
        descriptor_main.field_2._12_4_ = descriptor_main.field_2._12_4_ + -1;
        local_4c0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                     ,0x2f);
        local_4c0.filename = local_4c0.filename + 1;
        local_4c0.line = 0x3c7;
        local_4c0.funcname = "AnalyzeChild";
        logger::info<unsigned_int&>
                  (&local_4c0,"Target`)` depth_work = {}",
                   (uint *)(descriptor_main.field_2._M_local_buf + 0xc));
        if (descriptor_main.field_2._12_4_ == depth) {
          ::std::__cxx11::string::substr
                    ((ulong)((long)&node_2.parent_kind_.field_2 + 8),(ulong)descriptor);
          this_00 = (string *)(node_2.parent_kind_.field_2._M_local_buf + 8);
          ::std::__cxx11::string::operator=((string *)&this->value_,this_00);
          ::std::__cxx11::string::~string(this_00);
          bVar2 = true;
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)this,"addr");
          if ((!bVar1) &&
             (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)this,"raw"), !bVar1)) {
            DescriptorNode((DescriptorNode *)local_648,&this->addr_prefixes_);
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)this,"tr");
            if (bVar1) {
              node_2.depth_ = 1;
              ::std::__cxx11::string::operator=
                        ((string *)(node_2.name_.field_2._M_local_buf + 8),(string *)&this->value_);
              node_2.checksum_.field_2._8_4_ = depth + 1;
              descriptor_main.field_2._M_local_buf[0xb] = '\0';
            }
            else if ((descriptor_main.field_2._M_local_buf[0xb] & 1U) == 0) {
              node_2.depth_ = 2;
              ::std::__cxx11::string::operator=
                        ((string *)(node_2.name_.field_2._M_local_buf + 8),(string *)&this->value_);
              node_2.checksum_.field_2._8_4_ = depth + 1;
            }
            else {
              node_2.depth_ = 1;
              AnalyzeChild((DescriptorNode *)local_648,&this->value_,depth + 1);
              descriptor_main.field_2._M_local_buf[0xb] = '\0';
            }
            ::std::__cxx11::string::operator=
                      ((string *)
                       &node_2.addr_prefixes_.
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (string *)&this->parent_kind_);
            ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
            push_back(&this->child_node_,(value_type *)local_648);
            local_660.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                         ,0x2f);
            local_660.filename = local_660.filename + 1;
            local_660.line = 0x3e1;
            local_660.funcname = "AnalyzeChild";
            logger::info<unsigned_int&,std::__cxx11::string&>
                      (&local_660,"Target`)` depth_work={}, child.value={}",
                       (uint *)(descriptor_main.field_2._M_local_buf + 0xc),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&node_2.name_.field_2 + 8));
            ~DescriptorNode((DescriptorNode *)local_648);
          }
        }
      }
    }
    str = str + 1;
  } while( true );
}

Assistant:

void DescriptorNode::AnalyzeChild(
    const std::string& descriptor, uint32_t depth) {
  bool is_terminate = false;
  size_t offset = 0;
  uint32_t depth_work = depth;
  bool exist_child_node = false;
  depth_ = depth;
  std::string descriptor_main;
  info(CFD_LOG_SOURCE, "AnalyzeChild = {}", descriptor);

  for (size_t idx = 0; idx < descriptor.size(); ++idx) {
    const char& str = descriptor[idx];
    if (str == '#') {
      if (is_terminate) {
        offset = idx;
        checksum_ = descriptor.substr(idx + 1);
        descriptor_main = descriptor.substr(0, idx);
        if (checksum_.find("#") != std::string::npos) {
          warn(CFD_LOG_SOURCE, "Illegal data. Multiple '#' symbols.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Multiple '#' symbols.");
        }
      } else {
        warn(CFD_LOG_SOURCE, "Illegal checksum data.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Illegal checksum data.");
      }
    } else if (str == ',') {
      if (exist_child_node) {
        // through by child node
      } else if ((name_ == "multi") || (name_ == "sortedmulti")) {
        DescriptorNode node(addr_prefixes_);
        node.value_ = descriptor.substr(offset, idx - offset);
        info(CFD_LOG_SOURCE, "multisig, node.value_ = {}", node.value_);
        if (child_node_.empty()) {
          node.node_type_ = DescriptorNodeType::kDescriptorTypeNumber;
          node.number_ = atoi(node.value_.c_str());
        } else {
          node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
        }
        node.depth_ = depth + 1;
        node.parent_kind_ = parent_kind_;
        child_node_.push_back(node);
        offset = idx + 1;
      } else if (name_ == "tr") {
        if (child_node_.empty()) {
          DescriptorNode node(addr_prefixes_);
          node.value_ = descriptor.substr(offset, idx - offset);
          node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
          node.depth_ = depth + 1;
          node.parent_kind_ = parent_kind_;
          child_node_.push_back(node);
          offset = idx + 1;
        }
      } else {
        // ignore for miniscript
        // warn(CFD_LOG_SOURCE, "Illegal command.");
        // throw CfdException(
        //     CfdError::kCfdIllegalArgumentError, "Illegal command.");
      }
    } else if (str == ' ') {
      ++offset;
    } else if (str == '(') {
      if (depth_work == depth) {
        name_ = descriptor.substr(offset, idx - offset);
        offset = idx + 1;
      } else {
        exist_child_node = true;
      }
      info(
          CFD_LOG_SOURCE, "Target`(` depth_work={}, name={}", depth_work,
          name_);
      ++depth_work;
    } else if (str == ')') {
      --depth_work;
      info(CFD_LOG_SOURCE, "Target`)` depth_work = {}", depth_work);
      if (depth_work == depth) {
        value_ = descriptor.substr(offset, idx - offset);
        is_terminate = true;
        offset = idx + 1;
        if ((name_ == "addr") || (name_ == "raw")) {
          // do nothing
        } else {
          DescriptorNode node(addr_prefixes_);
          if (name_ == "tr") {
            node.node_type_ = DescriptorNodeType::kDescriptorTypeScript;
            node.value_ = value_;
            node.depth_ = depth + 1;
            exist_child_node = false;
          } else if (exist_child_node) {
            node.node_type_ = DescriptorNodeType::kDescriptorTypeScript;
            node.AnalyzeChild(value_, depth + 1);
            exist_child_node = false;
          } else {
            node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
            node.value_ = value_;
            node.depth_ = depth + 1;
          }
          node.parent_kind_ = parent_kind_;
          child_node_.push_back(node);
          info(
              CFD_LOG_SOURCE, "Target`)` depth_work={}, child.value={}",
              depth_work, node.value_);
        }
      }
    }
  }

  if (name_.empty() || (name_ == "addr") || (name_ == "raw")) {
    // do nothing
  } else if (child_node_.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to child node empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to child node empty.");
  }

  if (!descriptor_main.empty()) {
    CheckChecksum(descriptor_main);
  }
}